

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocl_generic_cn_generator.cpp
# Opt level: O0

uint32_t xmrig::getPossibleIntensity(OclDevice *device)

{
  uint32_t uVar1;
  uint *puVar2;
  uint32_t maxIntensity;
  size_t perThread;
  size_t availableMem;
  uint32_t maxThreads;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar1 = getMaxThreads((OclDevice *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  OclDevice::freeMemSize((OclDevice *)CONCAT44(uVar1,in_stack_fffffffffffffff0));
  puVar2 = std::min<unsigned_int>((uint *)&stack0xfffffffffffffff4,(uint *)&stack0xffffffffffffffdc)
  ;
  return *puVar2;
}

Assistant:

static inline uint32_t getPossibleIntensity(const OclDevice &device)
{
    const uint32_t maxThreads   = getMaxThreads(device);
    const size_t minFreeMem     = (maxThreads == 40000u ? 512u : 128u) * oneMiB;
    const size_t availableMem   = device.freeMemSize() - minFreeMem;
    const size_t perThread      = CnAlgo::CN_MEMORY + 224u;
    const auto maxIntensity     = static_cast<uint32_t>(availableMem / perThread);

    return std::min<uint32_t>(maxThreads, maxIntensity);
}